

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall pbrt::BinaryWriter::BinaryWriter(BinaryWriter *this,ostream *str)

{
  _Rb_tree_header *p_Var1;
  int32_t formatTag;
  undefined4 local_1c;
  
  (this->serializedEntity).c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->serializedEntity).c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->serializedEntity).c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->serializedEntity).c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->serializedEntity).c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->serializedEntity).c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->serializedEntity).c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->serializedEntity).c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->serializedEntity).c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->serializedEntity).c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
                       *)this,0);
  this->binStream = str;
  p_Var1 = &(this->emittedEntity)._M_t._M_impl.super__Rb_tree_header;
  (this->emittedEntity)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->emittedEntity)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->emittedEntity)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->emittedEntity)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->emittedEntity)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c = 9;
  std::ostream::write((char *)str,(long)&local_1c);
  return;
}

Assistant:

BinaryWriter(std::ostream& str)
      : binStream(str)
    {
      int32_t formatTag = ourFormatTag;
      binStream.write((char*)&formatTag,sizeof(formatTag));
    }